

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O0

uint64_t __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::copy_from_right_
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint64_t slot_id)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t in_RSI;
  compact_vector *in_RDI;
  uint64_t in_stack_00000010;
  uint64_t in_stack_00000018;
  uint64_t _slot_id;
  compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *in_stack_ffffffffffffffd0;
  compact_vector *this_00;
  
  this_00 = in_RDI;
  uVar1 = right_(in_stack_ffffffffffffffd0,(uint64_t)in_RDI);
  uVar2 = compact_vector::get(this_00,in_RSI);
  get_vbit_((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)
            (uVar2 & 0xfffffffffffffffd),(uint64_t)in_RDI);
  compact_vector::set((compact_vector *)_slot_id,in_stack_00000018,in_stack_00000010);
  return uVar1;
}

Assistant:

uint64_t copy_from_right_(uint64_t slot_id) {
        uint64_t _slot_id = right_(slot_id);
        table_.set(slot_id, (table_.get(_slot_id) & ~2ULL) | (get_vbit_(slot_id) << 1));
        return _slot_id;
    }